

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::type_caster_generic::try_load_foreign_module_local
          (type_caster_generic *this,handle src)

{
  handle obj;
  bool bVar1;
  type_info *ptVar2;
  _func_void_ptr_PyObject_ptr_type_info_ptr *p_Var3;
  void *pvVar4;
  handle local_30;
  object local_28;
  
  obj.m_ptr = (PyObject *)(src.m_ptr)->ob_type;
  bVar1 = hasattr(obj,"__pybind11_module_local_v4_clang_libstdcpp_cxxabi1002__");
  if (bVar1) {
    getattr((pybind11 *)&local_28,obj,"__pybind11_module_local_v4_clang_libstdcpp_cxxabi1002__");
    local_30 = local_28.super_handle.m_ptr;
    if (local_28.super_handle.m_ptr != (PyObject *)0x0) {
      *(long *)local_28.super_handle.m_ptr = *(long *)local_28.super_handle.m_ptr + 1;
    }
    ptVar2 = capsule::operator_cast_to_type_info_((capsule *)&local_30);
    object::~object((object *)&local_30);
    object::~object(&local_28);
    p_Var3 = ptVar2->module_local_load;
    if (p_Var3 != local_load) {
      if (this->cpptype != (type_info *)0x0) {
        bVar1 = std::type_info::operator==(this->cpptype,ptVar2->cpptype);
        if (!bVar1) {
          return false;
        }
        p_Var3 = ptVar2->module_local_load;
      }
      pvVar4 = (*p_Var3)(src.m_ptr,ptVar2);
      if (pvVar4 != (void *)0x0) {
        this->value = pvVar4;
        return true;
      }
    }
  }
  return false;
}

Assistant:

PYBIND11_NOINLINE bool try_load_foreign_module_local(handle src) {
        constexpr auto *local_key = PYBIND11_MODULE_LOCAL_ID;
        const auto pytype = src.get_type();
        if (!hasattr(pytype, local_key))
            return false;

        type_info *foreign_typeinfo = reinterpret_borrow<capsule>(getattr(pytype, local_key));
        // Only consider this foreign loader if actually foreign and is a loader of the correct cpp type
        if (foreign_typeinfo->module_local_load == &local_load
            || (cpptype && !same_type(*cpptype, *foreign_typeinfo->cpptype)))
            return false;

        if (auto result = foreign_typeinfo->module_local_load(src.ptr(), foreign_typeinfo)) {
            value = result;
            return true;
        }
        return false;
    }